

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExternModuleDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternModuleDeclSyntax,slang::syntax::ExternModuleDeclSyntax_const&>
          (BumpAllocator *this,ExternModuleDeclSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ExternModuleDeclSyntax *pEVar8;
  
  pEVar8 = (ExternModuleDeclSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExternModuleDeclSyntax *)this->endPtr < pEVar8 + 1) {
    pEVar8 = (ExternModuleDeclSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pEVar8 + 1);
  }
  (pEVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pEVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  uVar5 = (args->externKeyword).field_0x2;
  NVar6.raw = (args->externKeyword).numFlags.raw;
  uVar7 = (args->externKeyword).rawLen;
  pIVar3 = (args->externKeyword).info;
  (pEVar8->externKeyword).kind = (args->externKeyword).kind;
  (pEVar8->externKeyword).field_0x2 = uVar5;
  (pEVar8->externKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->externKeyword).rawLen = uVar7;
  (pEVar8->externKeyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar8->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4
  ;
  (pEVar8->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar8->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar8->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pEVar8->actualAttributes).super_SyntaxListBase.childCount =
       (args->actualAttributes).super_SyntaxListBase.childCount;
  sVar2 = (args->actualAttributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar8->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->actualAttributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar8->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar8->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (pEVar8->header).ptr = (args->header).ptr;
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }